

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenStructConstructor
          (CppGenerator *this,StructDef *struct_def,GenArrayArgMode array_mode)

{
  uint uVar1;
  Value *type;
  CodeWriter *this_00;
  BaseType BVar2;
  BaseType BVar3;
  pointer ppFVar4;
  FieldDef *pFVar5;
  pointer ppFVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *this_01;
  long lVar7;
  bool bVar8;
  int padding_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_name;
  string scalar_type;
  string init_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_name_1;
  string arg_list;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  arg_list._M_dataplus._M_p = (pointer)&arg_list.field_2;
  arg_list._M_string_length = 0;
  lVar7 = 0;
  init_list._M_dataplus._M_p = (pointer)&init_list.field_2;
  init_list._M_string_length = 0;
  padding_id = 0;
  arg_list.field_2._M_local_buf[0] = '\0';
  init_list.field_2._M_local_buf[0] = '\0';
  ppFVar6 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    ppFVar4 = (pointer)((long)ppFVar6 + lVar7);
    if (ppFVar4 ==
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (arg_list._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&arg_name,"ARG_LIST",(allocator<char> *)&scalar_type);
        this_00 = &this->code_;
        CodeWriter::SetValue(this_00,&arg_name,&arg_list);
        std::__cxx11::string::~string((string *)&arg_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&arg_name,"INIT_LIST",(allocator<char> *)&scalar_type);
        CodeWriter::SetValue(this_00,&arg_name,&init_list);
        std::__cxx11::string::~string((string *)&arg_name);
        if (init_list._M_string_length == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"  {{STRUCT_NAME}}({{ARG_LIST}}) {",
                     (allocator<char> *)&arg_name);
          CodeWriter::operator+=(this_00,&local_150);
          this_01 = &local_150;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"  {{STRUCT_NAME}}({{ARG_LIST}})",
                     (allocator<char> *)&arg_name);
          CodeWriter::operator+=(this_00,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"      : {{INIT_LIST}} {",(allocator<char> *)&arg_name);
          CodeWriter::operator+=(this_00,&local_130);
          this_01 = &local_130;
        }
        std::__cxx11::string::~string((string *)this_01);
        padding_id = 0;
        ppFVar4 = (struct_def->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppFVar6 = (struct_def->fields).vec.
                       super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppFVar6 != ppFVar4;
            ppFVar6 = ppFVar6 + 1) {
          pFVar5 = *ppFVar6;
          if ((array_mode != kArrayArgModeNone) &&
             ((pFVar5->value).type.base_type == BASE_TYPE_ARRAY)) {
            BVar2 = (pFVar5->value).type.element;
            bVar8 = (pFVar5->value).type.enum_def != (EnumDef *)0x0;
            uVar1 = BVar2 - BASE_TYPE_UTYPE;
            if ((0xb < uVar1) &&
               ((BVar2 != BASE_TYPE_STRUCT || (((pFVar5->value).type.struct_def)->fixed != true))))
            {
              __assert_fail("(IsScalar(element_type.base_type) || IsStruct(element_type)) && \"invalid declaration\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                            ,0xf34,
                            "void flatbuffers::cpp::CppGenerator::GenStructConstructor(const StructDef &, GenArrayArgMode)"
                           );
            }
            GenTypeGet_abi_cxx11_
                      (&arg_name,this,&(pFVar5->value).type," ","","",uVar1 < 10 && bVar8);
            if (uVar1 < 10 && bVar8) {
              std::operator+(&field_name,"CastToArrayOfEnum<",&arg_name);
              std::operator+(&scalar_type,&field_name,">");
              std::__cxx11::string::~string((string *)&field_name);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&scalar_type,"CastToArray",(allocator<char> *)&field_name);
            }
            Name_abi_cxx11_(&arg_name_1,this,*ppFVar6);
            std::operator+(&field_name,&arg_name_1,"_");
            std::__cxx11::string::~string((string *)&arg_name_1);
            Name_abi_cxx11_(&local_190,this,*ppFVar6);
            std::operator+(&arg_name_1,"_",&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            std::operator+(&local_d0,"    ::flatbuffers::",&scalar_type);
            std::operator+(&local_90,&local_d0,"(");
            std::operator+(&local_b0,&local_90,&field_name);
            std::operator+(&local_70,&local_b0,").CopyFromSpan(");
            std::operator+(&local_190,&local_70,&arg_name_1);
            std::operator+(&local_50,&local_190,");");
            CodeWriter::operator+=(this_00,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&arg_name_1);
            std::__cxx11::string::~string((string *)&field_name);
            std::__cxx11::string::~string((string *)&scalar_type);
            std::__cxx11::string::~string((string *)&arg_name);
            pFVar5 = *ppFVar6;
          }
          if (pFVar5->padding != 0) {
            arg_name._M_dataplus._M_p = (pointer)&arg_name.field_2;
            arg_name._M_string_length = 0;
            arg_name.field_2._M_local_buf[0] = '\0';
            scalar_type._M_string_length = 0;
            scalar_type._M_dataplus._M_p = (pointer)PaddingNoop;
            scalar_type.field_2._8_8_ =
                 std::
                 _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                 ::_M_invoke;
            scalar_type.field_2._M_allocated_capacity =
                 (size_type)
                 std::
                 _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                 ::_M_manager;
            GenPadding(*ppFVar6,&arg_name,&padding_id,
                       (function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                        *)&scalar_type);
            std::_Function_base::~_Function_base((_Function_base *)&scalar_type);
            std::__cxx11::string::string((string *)&local_f0,(string *)&arg_name);
            CodeWriter::operator+=(this_00,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&arg_name);
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"  }",(allocator<char> *)&arg_name);
        CodeWriter::operator+=(this_00,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
      }
      std::__cxx11::string::~string((string *)&init_list);
      std::__cxx11::string::~string((string *)&arg_list);
      return;
    }
    pFVar5 = *ppFVar4;
    BVar2 = (pFVar5->value).type.base_type;
    Name_abi_cxx11_(&scalar_type,this,pFVar5);
    std::operator+(&arg_name,"_",&scalar_type);
    type = &pFVar5->value;
    std::__cxx11::string::~string((string *)&scalar_type);
    if (BVar2 == BASE_TYPE_ARRAY && array_mode == kArrayArgModeNone) {
LAB_001606a9:
      if ((lVar7 != 0) && (init_list._M_string_length != 0)) {
        std::__cxx11::string::append((char *)&init_list);
      }
      Name_abi_cxx11_(&field_name,this,pFVar5);
      std::operator+(&scalar_type,&field_name,"_");
      std::__cxx11::string::append((string *)&init_list);
      std::__cxx11::string::~string((string *)&scalar_type);
      std::__cxx11::string::~string((string *)&field_name);
      BVar3 = (type->type).base_type;
      if (BVar3 - BASE_TYPE_UTYPE < 0xc) {
        GenUnderlyingCast(&scalar_type,this,pFVar5,false,&arg_name);
        std::operator+(&arg_name_1,"(::flatbuffers::EndianScalar(",&scalar_type);
        std::operator+(&field_name,&arg_name_1,"))");
        std::__cxx11::string::append((string *)&init_list);
        std::__cxx11::string::~string((string *)&field_name);
        std::__cxx11::string::~string((string *)&arg_name_1);
        __return_storage_ptr__ = &scalar_type;
LAB_00160792:
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      else {
        if (BVar2 != BASE_TYPE_ARRAY || array_mode != kArrayArgModeNone) {
          if ((BVar3 != BASE_TYPE_STRUCT) || (((pFVar5->value).type.struct_def)->fixed == false)) {
            __assert_fail("(is_array && !init_arrays) || IsStruct(type)",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                          ,0xf18,
                          "void flatbuffers::cpp::CppGenerator::GenStructConstructor(const StructDef &, GenArrayArgMode)"
                         );
          }
          if (BVar2 != BASE_TYPE_ARRAY) {
            __return_storage_ptr__ = &field_name;
            std::operator+(__return_storage_ptr__,"(",&arg_name);
            std::operator+(&scalar_type,__return_storage_ptr__,")");
            std::__cxx11::string::append((string *)&init_list);
            std::__cxx11::string::~string((string *)&scalar_type);
            goto LAB_00160792;
          }
        }
        std::__cxx11::string::append((char *)&init_list);
      }
    }
    else {
      if ((lVar7 != 0) && (arg_list._M_string_length != 0)) {
        std::__cxx11::string::append((char *)&arg_list);
      }
      if (BVar2 == BASE_TYPE_ARRAY) {
        GenTypeSpan_abi_cxx11_
                  (&scalar_type,this,&type->type,true,(ulong)(pFVar5->value).type.fixed_length);
      }
      else {
        GenTypeGet_abi_cxx11_(&scalar_type,this,&type->type," ","const "," &",true);
      }
      std::__cxx11::string::append((string *)&arg_list);
      std::__cxx11::string::~string((string *)&scalar_type);
      std::__cxx11::string::append((string *)&arg_list);
      if ((array_mode == kArrayArgModeNone) || (BVar2 != BASE_TYPE_ARRAY)) goto LAB_001606a9;
    }
    if (pFVar5->padding != 0) {
      scalar_type._M_string_length = 0;
      scalar_type._M_dataplus._M_p = (pointer)PaddingInitializer;
      scalar_type.field_2._8_8_ =
           std::
           _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
           ::_M_invoke;
      scalar_type.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*),_void_(*)(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
           ::_M_manager;
      GenPadding(pFVar5,&init_list,&padding_id,
                 (function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
                  *)&scalar_type);
      std::_Function_base::~_Function_base((_Function_base *)&scalar_type);
    }
    std::__cxx11::string::~string((string *)&arg_name);
    lVar7 = lVar7 + 8;
  } while( true );
}

Assistant:

void GenStructConstructor(const StructDef &struct_def,
                            GenArrayArgMode array_mode) {
    std::string arg_list;
    std::string init_list;
    int padding_id = 0;
    auto first = struct_def.fields.vec.begin();
    // skip arrays if generate ctor without array assignment
    const auto init_arrays = (array_mode != kArrayArgModeNone);
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      const auto &type = field.value.type;
      const auto is_array = IsArray(type);
      const auto arg_name = "_" + Name(field);
      if (!is_array || init_arrays) {
        if (it != first && !arg_list.empty()) { arg_list += ", "; }
        arg_list += !is_array ? GenTypeGet(type, " ", "const ", " &", true)
                              : GenTypeSpan(type, true, type.fixed_length);
        arg_list += arg_name;
      }
      // skip an array with initialization from span
      if (false == (is_array && init_arrays)) {
        if (it != first && !init_list.empty()) { init_list += ",\n        "; }
        init_list += Name(field) + "_";
        if (IsScalar(type.base_type)) {
          auto scalar_type = GenUnderlyingCast(field, false, arg_name);
          init_list += "(::flatbuffers::EndianScalar(" + scalar_type + "))";
        } else {
          FLATBUFFERS_ASSERT((is_array && !init_arrays) || IsStruct(type));
          if (!is_array)
            init_list += "(" + arg_name + ")";
          else
            init_list += "()";
        }
      }
      if (field.padding)
        GenPadding(field, &init_list, &padding_id, PaddingInitializer);
    }

    if (!arg_list.empty()) {
      code_.SetValue("ARG_LIST", arg_list);
      code_.SetValue("INIT_LIST", init_list);
      if (!init_list.empty()) {
        code_ += "  {{STRUCT_NAME}}({{ARG_LIST}})";
        code_ += "      : {{INIT_LIST}} {";
      } else {
        code_ += "  {{STRUCT_NAME}}({{ARG_LIST}}) {";
      }
      padding_id = 0;
      for (const auto &field : struct_def.fields.vec) {
        const auto &type = field->value.type;
        if (IsArray(type) && init_arrays) {
          const auto &element_type = type.VectorType();
          const auto is_enum = IsEnum(element_type);
          FLATBUFFERS_ASSERT(
              (IsScalar(element_type.base_type) || IsStruct(element_type)) &&
              "invalid declaration");
          const auto face_type = GenTypeGet(type, " ", "", "", is_enum);
          std::string get_array =
              is_enum ? "CastToArrayOfEnum<" + face_type + ">" : "CastToArray";
          const auto field_name = Name(*field) + "_";
          const auto arg_name = "_" + Name(*field);
          code_ += "    ::flatbuffers::" + get_array + "(" + field_name +
                   ").CopyFromSpan(" + arg_name + ");";
        }
        if (field->padding) {
          std::string padding;
          GenPadding(*field, &padding, &padding_id, PaddingNoop);
          code_ += padding;
        }
      }
      code_ += "  }";
    }
  }